

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* pstore::path::win32::split_drive
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *path)

{
  ulong uVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  long local_88;
  size_type index2;
  long local_78;
  size_type index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  char *local_58;
  char *local_50;
  string local_38 [8];
  string normp;
  string *path_local;
  
  uVar1 = std::__cxx11::string::length();
  if (1 < uVar1) {
    std::__cxx11::string::string(local_38);
    std::__cxx11::string::length();
    std::__cxx11::string::reserve((ulong)local_38);
    local_50 = (char *)std::begin<std::__cxx11::string>(path);
    local_58 = (char *)std::end<std::__cxx11::string>(path);
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::back_inserter<std::__cxx11::string>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38);
    index = (size_type)
            std::
            transform<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>,pstore::path::win32::split_drive(std::__cxx11::string_const&)::__0>
                      (local_50,local_58,local_60);
    uVar1 = std::__cxx11::string::length();
    if ((((uVar1 < 3) ||
         (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_38), *pcVar2 != '/')) ||
        (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_38), *pcVar2 != '/')) ||
       ((uVar1 = std::__cxx11::string::length(), uVar1 < 4 ||
        (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_38), *pcVar2 == '/')))) {
      uVar1 = std::__cxx11::string::length();
      if ((uVar1 < 2) ||
         (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_38), *pcVar2 != ':')) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[1],_true>(__return_storage_ptr__,(char (*) [1])0x15f0a0,path);
      }
      else {
        std::__cxx11::string::substr((ulong)local_e8,(ulong)path);
        std::__cxx11::string::substr((ulong)local_108,(ulong)path);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (__return_storage_ptr__,local_e8,local_108);
        std::__cxx11::string::~string((string *)local_108);
        std::__cxx11::string::~string((string *)local_e8);
      }
    }
    else {
      local_78 = std::__cxx11::string::find((char)local_38,0x2f);
      if (local_78 == -1) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[1],_true>(__return_storage_ptr__,(char (*) [1])0x15f0a0,path);
      }
      else {
        local_88 = std::__cxx11::string::find((char)local_38,0x2f);
        if (local_88 == local_78 + 1) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[1],_true>(__return_storage_ptr__,(char (*) [1])0x15f0a0,path);
        }
        else {
          if (local_88 == -1) {
            local_88 = std::__cxx11::string::length();
          }
          std::__cxx11::string::substr((ulong)local_a8,(ulong)path);
          std::__cxx11::string::substr((ulong)local_c8,(ulong)path);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (__return_storage_ptr__,local_a8,local_c8);
          std::__cxx11::string::~string((string *)local_c8);
          std::__cxx11::string::~string((string *)local_a8);
        }
      }
    }
    index2._4_4_ = 1;
    std::__cxx11::string::~string(local_38);
    return __return_storage_ptr__;
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[1],_true>(__return_storage_ptr__,(char (*) [1])0x15f0a0,path);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string> split_drive (std::string const & path) {
                if (path.length () <= 1) {
                    return {"", path};
                }

                // Normalize the slash direction.
                std::string normp;
                normp.reserve (path.length ());
                std::transform (std::begin (path), std::end (path), std::back_inserter (normp),
                                [] (char const c) { return c == '\\' ? '/' : c; });

                if ((normp.length () > 2 && normp[0] == '/' && normp[1] == '/') &&
                    (normp.length () > 3 && normp[2] != '/')) {
                    // This is is a UNC path:
                    // vvvvvvvvvvvvvvvvvvvv drive letter or UNC path
                    // \\machine\mountpoint\directory\etc\...
                    //           directory ^^^^^^^^^^^^^^^
                    std::string::size_type const index = normp.find ('/', 2);
                    if (index == std::string::npos) {
                        return {"", path};
                    }

                    std::string::size_type index2 = normp.find ('/', index + 1);
                    // An UNC path can't have two slashes in a row (after the initial two)
                    if (index2 == index + 1) {
                        return {"", path};
                    }
                    if (index2 == std::string::npos) {
                        index2 = path.length ();
                    }
                    return {path.substr (0, index2), path.substr (index2, std::string::npos)};
                }
                if (normp.length () > 1 && normp[1] == ':') {
                    return {path.substr (0, 2), path.substr (2, std::string::npos)};
                }
                return {"", path};
            }